

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
writeValueRankAttribute
          (UA_Server *server,UA_VariableNode *node,UA_Int32 valueRank,UA_Int32 constraintValueRank)

{
  UA_Boolean UVar1;
  UA_StatusCode UVar2;
  int iVar3;
  UA_DataValue *in_R8;
  size_t arrayDimensionsSize;
  undefined1 auStack_98 [8];
  UA_DataValue value;
  
  if ((node->nodeClass == UA_NODECLASS_VARIABLETYPE) &&
     (UVar1 = UA_Node_hasSubTypeOrInstances((UA_Node *)node), UVar1)) {
    return 0x80020000;
  }
  switch(constraintValueRank) {
  case 0:
    if (valueRank < 0) {
      return 0x80740000;
    }
    break;
  case -3:
    if ((valueRank != -1) && (valueRank != 1)) {
      return 0x80740000;
    }
    break;
  case -2:
    break;
  case -1:
    if (valueRank != -1) {
      return 0x80740000;
    }
    break;
  default:
    if (valueRank != constraintValueRank) {
      return 0x80740000;
    }
  }
  arrayDimensionsSize = node->arrayDimensionsSize;
  if (arrayDimensionsSize == 0) {
    value.sourcePicoseconds = 0;
    value._74_6_ = 0;
    value.serverTimestamp = 0;
    value.status = 0;
    value._60_4_ = 0;
    value.sourceTimestamp = 0;
    value.value.arrayDimensionsSize = 0;
    value.value.arrayDimensions = (UA_UInt32 *)0x0;
    value.value.arrayLength = 0;
    value.value.data = (void *)0x0;
    value.value.type = (UA_DataType *)0x0;
    value.value.storageType = UA_VARIANT_DATA;
    value.value._12_4_ = 0;
    auStack_98 = (undefined1  [8])0x0;
    value._0_8_ = 0;
    UVar2 = readValueAttributeComplete
                      ((UA_Server *)node,(UA_VariableNode *)0x3,UA_TIMESTAMPSTORETURN_SOURCE,
                       (UA_String *)auStack_98,in_R8);
    iVar3 = 1;
    arrayDimensionsSize = 0;
    if (UVar2 == 0) {
      arrayDimensionsSize = 0;
      if (((ulong)auStack_98 & 1) == 0) {
        iVar3 = 3;
      }
      else {
        iVar3 = 3;
        arrayDimensionsSize = 0;
        if (value.value.arrayLength != 0) {
          arrayDimensionsSize = (size_t)(value.value.arrayLength < 2 || value.value._8_8_ != 0);
          deleteMembers_noInit(auStack_98,UA_TYPES + 0x16);
          value.sourcePicoseconds = 0;
          value._74_6_ = 0;
          value.serverTimestamp = 0;
          value.status = 0;
          value._60_4_ = 0;
          value.sourceTimestamp = 0;
          value.value.arrayDimensionsSize = 0;
          value.value.arrayDimensions = (UA_UInt32 *)0x0;
          value.value.arrayLength = 0;
          value.value.data = (void *)0x0;
          value.value.type = (UA_DataType *)0x0;
          value.value.storageType = UA_VARIANT_DATA;
          value.value._12_4_ = 0;
          auStack_98 = (undefined1  [8])0x0;
          value._0_8_ = 0;
          iVar3 = 0;
        }
      }
    }
    if (iVar3 == 3) goto LAB_0011ee74;
    if (iVar3 != 0) {
      return UVar2;
    }
  }
  UVar2 = compatibleValueRankArrayDimensions(valueRank,arrayDimensionsSize);
  if (UVar2 != 0) {
    return UVar2;
  }
LAB_0011ee74:
  node->valueRank = valueRank;
  return 0;
}

Assistant:

UA_StatusCode
writeValueRankAttribute(UA_Server *server, UA_VariableNode *node, UA_Int32 valueRank,
                        UA_Int32 constraintValueRank) {
    /* If this is a variabletype, there must be no instances or subtypes of it
       when we do the change */
    if(node->nodeClass == UA_NODECLASS_VARIABLETYPE &&
       UA_Node_hasSubTypeOrInstances((const UA_Node*)node))
        return UA_STATUSCODE_BADINTERNALERROR;

    /* Check if the valuerank of the variabletype allows the change. */
    switch(constraintValueRank) {
    case -3: /* the value can be a scalar or a one dimensional array */
        if(valueRank != -1 && valueRank != 1)
            return UA_STATUSCODE_BADTYPEMISMATCH;
        break;
    case -2: /* the value can be a scalar or an array with any number of dimensions */
        break;
    case -1: /* the value is a scalar */
        if(valueRank != -1)
            return UA_STATUSCODE_BADTYPEMISMATCH;
        break;
    case 0: /* the value is an array with one or more dimensions */
        if(valueRank < 0)
            return UA_STATUSCODE_BADTYPEMISMATCH;
        break;
    default: /* >= 1: the value is an array with the specified number of dimensions */
        if(valueRank != constraintValueRank)
            return UA_STATUSCODE_BADTYPEMISMATCH;
        break;
    }

    /* Check if the new valuerank is compatible with the array dimensions. Use
     * the read service to handle data sources. */
    size_t arrayDims = node->arrayDimensionsSize;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    if(arrayDims == 0) {
        /* the value could be an array with no arrayDimensions defined.
           dimensions zero indicate a scalar for compatibleValueRankArrayDimensions. */
        UA_DataValue value;
        UA_DataValue_init(&value);
        retval = readValueAttribute(server, node, &value);
        if(retval != UA_STATUSCODE_GOOD)
            return retval;
        if(!value.hasValue || value.value.data == NULL)
            goto apply; /* no value or null array */
        if(!UA_Variant_isScalar(&value.value))
            arrayDims = 1;
        UA_DataValue_deleteMembers(&value);
    }
    retval = compatibleValueRankArrayDimensions(valueRank, arrayDims);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* All good, apply the change */
 apply:
    node->valueRank = valueRank;
    return UA_STATUSCODE_GOOD;
}